

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O0

void __thiscall fat::get_cluster_content(fat *this,int32_t cluster)

{
  reference pvVar1;
  int32_t cluster_local;
  fat *this_local;
  
  if (this->fat_table[cluster] == this->FAT_FILE_END) {
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->cluster_data,(long)cluster);
    std::operator<<((ostream *)&std::cout,(string *)pvVar1);
  }
  else {
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->cluster_data,(long)cluster);
    std::operator<<((ostream *)&std::cout,(string *)pvVar1);
    get_cluster_content(this,this->fat_table[cluster]);
  }
  return;
}

Assistant:

void fat::get_cluster_content(int32_t cluster) {
    //pokud je prazdny (tedy zacina 0, tak nevypisuj obsah)
    if (fat_table[cluster] == FAT_FILE_END) {
        std::cout << cluster_data.at(cluster);
    } else {
        std::cout << cluster_data.at(cluster);
        get_cluster_content(fat_table[cluster]);
    }
}